

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_setup_pred_block
               (MACROBLOCKD *xd,buf_2d *dst,YV12_BUFFER_CONFIG *src,scale_factors *scale,
               scale_factors *scale_uv,int num_planes)

{
  undefined4 uVar1;
  int mi_col_00;
  buf_2d *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  buf_2d *in_R8;
  int in_R9D;
  int i;
  int mi_col;
  int mi_row;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff64;
  BLOCK_SIZE in_stack_ffffffffffffff6f;
  buf_2d *dst_00;
  int in_stack_ffffffffffffffa0;
  int local_50;
  
  *in_RSI = *(undefined8 *)(in_RDX + 0x28);
  *(undefined4 *)(in_RSI + 3) = *(undefined4 *)(in_RDX + 0x20);
  in_RSI[4] = *(undefined8 *)(in_RDX + 0x30);
  in_RSI[8] = *(undefined8 *)(in_RDX + 0x38);
  uVar1 = *(undefined4 *)(in_RDX + 0x24);
  *(undefined4 *)(in_RSI + 0xb) = uVar1;
  *(undefined4 *)(in_RSI + 7) = uVar1;
  mi_col_00 = *(int *)(in_RDI + 4);
  for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
    if (local_50 == 0) {
      uVar1 = *(undefined4 *)(in_RDX + 0x10);
    }
    else {
      uVar1 = *(undefined4 *)(in_RDX + 0x14);
    }
    dst_00 = in_RCX;
    if (local_50 != 0) {
      dst_00 = in_R8;
    }
    setup_pred_plane(dst_00,in_stack_ffffffffffffff6f,
                     (uint8_t *)
                     CONCAT44(in_stack_ffffffffffffff64,
                              *(undefined4 *)(in_RDI + (long)local_50 * 0xa30 + 0x14)),
                     (int)((ulong)dst_00 >> 0x20),(int)dst_00,in_stack_ffffffffffffff54,
                     *(int *)(in_RSI + (long)local_50 * 4 + 3),mi_col_00,
                     (scale_factors *)CONCAT44(uVar1,uVar1),(int)in_RSI + local_50 * 0x20,
                     in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void av1_setup_pred_block(const MACROBLOCKD *xd,
                          struct buf_2d dst[MAX_MB_PLANE],
                          const YV12_BUFFER_CONFIG *src,
                          const struct scale_factors *scale,
                          const struct scale_factors *scale_uv,
                          const int num_planes) {
  dst[0].buf = src->y_buffer;
  dst[0].stride = src->y_stride;
  dst[1].buf = src->u_buffer;
  dst[2].buf = src->v_buffer;
  dst[1].stride = dst[2].stride = src->uv_stride;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  for (int i = 0; i < num_planes; ++i) {
    setup_pred_plane(dst + i, xd->mi[0]->bsize, dst[i].buf,
                     i ? src->uv_crop_width : src->y_crop_width,
                     i ? src->uv_crop_height : src->y_crop_height,
                     dst[i].stride, mi_row, mi_col, i ? scale_uv : scale,
                     xd->plane[i].subsampling_x, xd->plane[i].subsampling_y);
  }
}